

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O3

int prepare_symbol(internal_binding_t *binding)

{
  gotcha_binding_t *pgVar1;
  library_t *plVar2;
  long lVar3;
  link_map *map;
  void *symbol;
  void *local_30;
  
  pgVar1 = binding->user_binding;
  if (1 < debug_level) {
    prepare_symbol_cold_1();
  }
  if (___throw_regex_error != (link_map *)0x0) {
    map = ___throw_regex_error;
    do {
      plVar2 = get_library(map);
      if (plVar2 == (library_t *)0x0) {
        if (2 < debug_level) {
          prepare_symbol_cold_2();
        }
        add_library(map);
      }
      lVar3 = lookup_exported_symbol(pgVar1->name,map,&local_30);
      if ((int)lVar3 != -1) {
        setInternalBindingAddressPointer((void **)*pgVar1->function_handle,local_30);
        return 0;
      }
      map = map->l_next;
    } while (map != (link_map *)0x0);
  }
  if (0 < debug_level) {
    prepare_symbol_cold_3();
  }
  return -1;
}

Assistant:

int prepare_symbol(struct internal_binding_t *binding) {
  int result = 0;
  struct link_map *lib = NULL;
  struct gotcha_binding_t *user_binding = binding->user_binding;

  debug_printf(2, "Looking up exported symbols for %s\n", user_binding->name);
  for (lib = _r_debug.r_map; lib != 0; lib = lib->l_next) {
    struct library_t *int_library = get_library(lib);
    if (!int_library) {
      debug_printf(3, "Creating new library object for %s\n", LIB_NAME(lib));
      int_library = add_library(lib);
    }
    void *symbol;
    result = lookup_exported_symbol(user_binding->name, lib, &symbol);
    if (result != -1) {
      setInternalBindingAddressPointer(user_binding->function_handle, symbol);
      return 0;
    }
  }
  debug_printf(1, "Symbol %s was found in program\n", user_binding->name);
  return -1;
}